

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O2

int AddFrame(WebPDemuxer *dmux,Frame *frame)

{
  Frame *pFVar1;
  
  pFVar1 = *dmux->frames_tail;
  if ((pFVar1 != (Frame *)0x0) && (pFVar1->complete == 0)) {
    return 0;
  }
  *dmux->frames_tail = frame;
  frame->next = (Frame *)0x0;
  dmux->frames_tail = &frame->next;
  return 1;
}

Assistant:

static int AddFrame(WebPDemuxer* const dmux, Frame* const frame) {
  const Frame* const last_frame = *dmux->frames_tail;
  if (last_frame != NULL && !last_frame->complete) return 0;

  *dmux->frames_tail = frame;
  frame->next = NULL;
  dmux->frames_tail = &frame->next;
  return 1;
}